

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

int __thiscall
CLI::Option::_add_result
          (Option *this,string *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  pointer result_00;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  string local_48;
  
  if ((((this->allow_extra_args_ == true) && (result->_M_string_length != 0)) &&
      (pcVar2 = (result->_M_dataplus)._M_p, *pcVar2 == '[')) &&
     (pcVar2[result->_M_string_length - 1] == ']')) {
    ::std::__cxx11::string::pop_back();
    ::std::__cxx11::string::substr((ulong)&local_48,(ulong)result);
    detail::split(&local_60,&local_48,',');
    ::std::__cxx11::string::~string((string *)&local_48);
    iVar5 = 0;
    for (result_00 = local_60.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        result_00 !=
        local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; result_00 = result_00 + 1) {
      if (result_00->_M_string_length != 0) {
        iVar3 = _add_result(this,result_00,res);
        iVar5 = iVar5 + iVar3;
      }
    }
    this_00 = (string *)&local_60;
LAB_001360f3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
  }
  else {
    cVar1 = (this->super_OptionBase<CLI::Option>).delimiter_;
    if (cVar1 != '\0') {
      iVar5 = 0;
      lVar4 = ::std::__cxx11::string::find((char)result,(ulong)(uint)(int)cVar1);
      if (lVar4 != -1) {
        detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_48,result,(this->super_OptionBase<CLI::Option>).delimiter_);
        for (; local_48._M_dataplus._M_p != (pointer)local_48._M_string_length;
            local_48._M_dataplus._M_p = local_48._M_dataplus._M_p + 0x20) {
          if (((value_type *)local_48._M_dataplus._M_p)->_M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(res,(value_type *)local_48._M_dataplus._M_p);
            iVar5 = iVar5 + 1;
          }
        }
        this_00 = &local_48;
        goto LAB_001360f3;
      }
    }
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,result);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int _add_result(std::string &&result, std::vector<std::string> &res) const {
        int result_count = 0;
        if(allow_extra_args_ && !result.empty() && result.front() == '[' &&
           result.back() == ']') { // this is now a vector string likely from the default or user entry
            result.pop_back();

            for(auto &var : CLI::detail::split(result.substr(1), ',')) {
                if(!var.empty()) {
                    result_count += _add_result(std::move(var), res);
                }
            }
            return result_count;
        }
        if(delimiter_ == '\0') {
            res.push_back(std::move(result));
            ++result_count;
        } else {
            if((result.find_first_of(delimiter_) != std::string::npos)) {
                for(const auto &var : CLI::detail::split(result, delimiter_)) {
                    if(!var.empty()) {
                        res.push_back(var);
                        ++result_count;
                    }
                }
            } else {
                res.push_back(std::move(result));
                ++result_count;
            }
        }
        return result_count;
    }